

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::CategoricalMapping::set_strvalue(CategoricalMapping *this,string *value)

{
  if (this->_oneof_case_[1] != 0x65) {
    clear_ValueOnUnknown(this);
    this->_oneof_case_[1] = 0x65;
    (this->ValueOnUnknown_).int64value_ =
         (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&(this->ValueOnUnknown_).strvalue_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,value);
  return;
}

Assistant:

inline void CategoricalMapping::set_strvalue(const ::std::string& value) {
  // @@protoc_insertion_point(field_set:CoreML.Specification.CategoricalMapping.strValue)
  if (!has_strvalue()) {
    clear_ValueOnUnknown();
    set_has_strvalue();
    ValueOnUnknown_.strvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  ValueOnUnknown_.strvalue_.SetNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), value);
  // @@protoc_insertion_point(field_set:CoreML.Specification.CategoricalMapping.strValue)
}